

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void WriteHeader(ostream *os,char *Name)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"//");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"// Source: ");
  poVar1 = std::operator<<(poVar1,Name);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"// Translated from Basic to C++ using btran");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"//");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void WriteHeader(
	std::ostream& os,		/**< Output stream */
	const char* Name		/**< File name */
)
{
#ifdef HAVE_STRFTIME
	char Text[64];
	time_t timer;
	struct tm *tblock;

	timer = time((time_t*)NULL);
	tblock = localtime(&timer);

	strftime(Text, sizeof(Text), "%A, %B %d, %Y at %X",
		tblock);
#endif

	os << "//" << std::endl;
	os << "// Source: " << Name << std::endl;
	os << "// Translated from Basic to C++ using btran" << std::endl;
#ifdef HAVE_STRFTIME
	os << "// on " << Text << std::endl;
#endif
	os << "//" << std::endl << std::endl;
}